

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::safe_parse_negative_int<long>(string *text,long *value_p)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  ulong uVar7;
  
  sVar1 = text->_M_string_length;
  bVar3 = (long)sVar1 < 1;
  if ((long)sVar1 < 1) {
    lVar6 = 0;
  }
  else {
    pbVar5 = (byte *)(text->_M_dataplus)._M_p;
    pbVar4 = pbVar5 + sVar1;
    lVar6 = 0;
    do {
      if ((byte)(*pbVar5 - 0x3a) < 0xf6) {
        *value_p = lVar6;
LAB_002cdfb6:
        bVar2 = false;
      }
      else {
        if (lVar6 < -0xccccccccccccccc) {
          *value_p = -0x8000000000000000;
          goto LAB_002cdfb6;
        }
        uVar7 = (ulong)(*pbVar5 & 0xf);
        if (lVar6 * 10 < (long)(uVar7 | 0x8000000000000000)) {
          *value_p = -0x8000000000000000;
          bVar2 = false;
          lVar6 = -0x7ffffffffffffff8;
        }
        else {
          lVar6 = lVar6 * 10 - uVar7;
          bVar2 = true;
        }
      }
      if (!bVar2) {
        return bVar3;
      }
      pbVar5 = pbVar5 + 1;
      bVar3 = pbVar5 >= pbVar4;
    } while (pbVar5 < pbVar4);
  }
  *value_p = lVar6;
  return bVar3;
}

Assistant:

char *InternalFastHexToBuffer(uint64 value, char* buffer, int num_byte) {
  static const char *hexdigits = "0123456789abcdef";
  buffer[num_byte] = '\0';
  for (int i = num_byte - 1; i >= 0; i--) {
#ifdef _M_X64
    // MSVC x64 platform has a bug optimizing the uint32(value) in the #else
    // block. Given that the uint32 cast was to improve performance on 32-bit
    // platforms, we use 64-bit '&' directly.
    buffer[i] = hexdigits[value & 0xf];
#else
    buffer[i] = hexdigits[uint32(value) & 0xf];
#endif
    value >>= 4;
  }
  return buffer;
}